

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibLut.c
# Opt level: O1

If_LibLut_t * If_LibLutReadString(char *pStr)

{
  char *pcVar1;
  float fVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  uint *__ptr;
  void *pvVar6;
  size_t sVar7;
  char *__dest;
  If_LibLut_t *__s;
  long lVar8;
  uint uVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  float (*pafVar13) [33];
  double dVar14;
  
  if ((pStr == (char *)0x0) || (*pStr == '\0')) {
    __s = (If_LibLut_t *)0x0;
  }
  else {
    __ptr = (uint *)malloc(0x10);
    __ptr[0] = 1000;
    __ptr[1] = 0;
    pvVar6 = malloc(8000);
    *(void **)(__ptr + 2) = pvVar6;
    sVar7 = strlen(pStr);
    __dest = (char *)malloc(sVar7 + 1);
    strcpy(__dest,pStr);
    cVar3 = *__dest;
    pcVar10 = __dest;
    while (cVar3 != '\0') {
      uVar4 = __ptr[1];
      uVar9 = *__ptr;
      if (uVar4 == uVar9) {
        if ((int)uVar9 < 0x10) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar6 = malloc(0x80);
          }
          else {
            pvVar6 = realloc(*(void **)(__ptr + 2),0x80);
          }
          uVar5 = 0x10;
        }
        else {
          uVar5 = uVar9 * 2;
          if ((int)uVar5 <= (int)uVar9) goto LAB_004005ea;
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar6 = malloc((ulong)uVar9 << 4);
          }
          else {
            pvVar6 = realloc(*(void **)(__ptr + 2),(ulong)uVar9 << 4);
          }
        }
        *(void **)(__ptr + 2) = pvVar6;
        *__ptr = uVar5;
      }
LAB_004005ea:
      __ptr[1] = uVar4 + 1;
      *(char **)(*(long *)(__ptr + 2) + (long)(int)uVar4 * 8) = pcVar10;
      pcVar10 = pcVar10 + -1;
      do {
        pcVar1 = pcVar10 + 1;
        pcVar10 = pcVar10 + 1;
      } while (*pcVar1 != '\n');
      cVar3 = *pcVar10;
      while (cVar3 == '\n') {
        *pcVar10 = '\0';
        cVar3 = pcVar10[1];
        pcVar10 = pcVar10 + 1;
      }
      cVar3 = *pcVar10;
    }
    __s = (If_LibLut_t *)malloc(0x1198);
    memset(__s,0,0x1198);
    uVar4 = __ptr[1];
    if ((long)(int)uVar4 < 1) {
      uVar9 = 1;
    }
    else {
      pvVar6 = *(void **)(__ptr + 2);
      uVar9 = 1;
      lVar8 = 0;
      do {
        pcVar10 = *(char **)((long)pvVar6 + lVar8 * 8);
        if (((*pcVar10 != '\0') && (pcVar10 = strtok(pcVar10," \t\n"), pcVar10 != (char *)0x0)) &&
           (*pcVar10 != '#')) {
          uVar5 = atoi(pcVar10);
          if (uVar9 == uVar5) {
            uVar11 = 0;
            pcVar10 = strtok((char *)0x0," \t\n");
            dVar14 = atof(pcVar10);
            __s->pLutAreas[(int)uVar9] = (float)dVar14;
            pcVar10 = strtok((char *)0x0," \t\n");
            if (pcVar10 != (char *)0x0) {
              uVar11 = 0;
              do {
                dVar14 = atof(pcVar10);
                __s->pLutDelays[(int)uVar9][uVar11] = (float)dVar14;
                uVar11 = uVar11 + 1;
                pcVar10 = strtok((char *)0x0," \t\n");
              } while (pcVar10 != (char *)0x0);
            }
            if ((int)uVar9 < (int)(uint)uVar11) {
              Abc_Print(1,"LUT %d has too many pins (%d). Max allowed is %d.\n",(ulong)uVar9,
                        uVar11 & 0xffffffff,(ulong)uVar9);
            }
            else {
              if (1 < (uint)uVar11) {
                __s->fVarPinDelays = 1;
              }
              if (uVar9 != 0x20) {
                uVar9 = uVar9 + 1;
                goto LAB_00400778;
              }
              Abc_Print(1,"Skipping LUTs of size more than %d.\n",0x20);
            }
          }
          else {
            Abc_Print(1,"Error in the LUT library string.\n");
          }
          if (__s->pName != (char *)0x0) {
            free(__s->pName);
            __s->pName = (char *)0x0;
          }
          free(__s);
          free(__dest);
          __s = (If_LibLut_t *)0x0;
          if (pvVar6 == (void *)0x0) goto LAB_004008d4;
          goto LAB_004008c4;
        }
LAB_00400778:
        lVar8 = lVar8 + 1;
      } while (lVar8 != (int)uVar4);
    }
    __s->LutMax = uVar9 - 1;
    if (__s->fVarPinDelays == 0) {
      if (1 < (int)uVar9) {
        pafVar13 = __s->pLutDelays;
        uVar11 = 1;
        do {
          pafVar13 = pafVar13 + 1;
          if ((*pafVar13)[0] <= 0.0) {
            Abc_Print(0,
                      "LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n"
                      ,(double)(*pafVar13)[0],uVar11 & 0xffffffff);
          }
          uVar11 = uVar11 + 1;
        } while (uVar9 != uVar11);
      }
    }
    else if (1 < (int)uVar9) {
      pafVar13 = __s->pLutDelays;
      uVar11 = 1;
      do {
        pafVar13 = pafVar13 + 1;
        uVar12 = 0;
        do {
          fVar2 = (*pafVar13)[uVar12];
          if (fVar2 <= 0.0) {
            Abc_Print(0,
                      "Pin %d of LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n"
                      ,(double)fVar2,uVar12 & 0xffffffff,uVar11 & 0xffffffff);
          }
          if ((uVar12 != 0) && (fVar2 < pafVar13[-1][uVar12 + 0x20])) {
            Abc_Print(0,
                      "Pin %d of LUT %d has delay %f. Pin %d of LUT %d has delay %f. Pin delays should be in non-decreasing order. Technology mapping may not work correctly.\n"
                      ,(double)pafVar13[-1][uVar12 + 0x20],(double)fVar2,(ulong)((int)uVar12 - 1),
                      uVar11 & 0xffffffff,uVar12 & 0xffffffff,uVar11 & 0xffffffff);
          }
          uVar12 = uVar12 + 1;
        } while (uVar11 != uVar12);
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar9);
    }
    free(__dest);
    pvVar6 = *(void **)(__ptr + 2);
    if (pvVar6 != (void *)0x0) {
LAB_004008c4:
      free(pvVar6);
      __ptr[2] = 0;
      __ptr[3] = 0;
    }
LAB_004008d4:
    free(__ptr);
  }
  return __s;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Reads the description of LUTs from the LUT library file.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
If_LibLut_t * If_LibLutReadString( char * pStr )
{
    If_LibLut_t * p;
    Vec_Ptr_t * vStrs;
    char * pToken, * pBuffer, * pStrNew, * pStrMem;
    int i, k, j;

    if ( pStr == NULL || pStr[0] == 0 )
        return NULL;

    vStrs = Vec_PtrAlloc( 1000 );
    pStrNew = pStrMem = Abc_UtilStrsav( pStr );
    while ( *pStrNew )
    {
        Vec_PtrPush( vStrs, pStrNew );
        while ( *pStrNew != '\n' )
            pStrNew++;
        while ( *pStrNew == '\n' )
            *pStrNew++ = '\0';
    }

    p = ABC_ALLOC( If_LibLut_t, 1 );
    memset( p, 0, sizeof(If_LibLut_t) );

    i = 1;
    //while ( fgets( pBuffer, 1000, pFile ) != NULL )
    Vec_PtrForEachEntry( char *, vStrs, pBuffer, j )
    {
        if ( pBuffer[0] == 0 )
            continue;
        pToken = strtok( pBuffer, " \t\n" );
        if ( pToken == NULL )
            continue;
        if ( pToken[0] == '#' )
            continue;
        if ( i != atoi(pToken) )
        {
            Abc_Print( 1, "Error in the LUT library string.\n" );
            ABC_FREE( p->pName );
            ABC_FREE( p );
            ABC_FREE( pStrMem );
            Vec_PtrFree( vStrs );
            return NULL;
        }

        // read area
        pToken = strtok( NULL, " \t\n" );
        p->pLutAreas[i] = (float)atof(pToken);

        // read delays
        k = 0;
        while ( (pToken = strtok( NULL, " \t\n" )) )
            p->pLutDelays[i][k++] = (float)atof(pToken);

        // check for out-of-bound
        if ( k > i )
        {
            Abc_Print( 1, "LUT %d has too many pins (%d). Max allowed is %d.\n", i, k, i );
            ABC_FREE( p->pName );
            ABC_FREE( p );
            ABC_FREE( pStrMem );
            Vec_PtrFree( vStrs );
            return NULL;
        }

        // check if var delays are specified
        if ( k > 1 )
            p->fVarPinDelays = 1;

        if ( i == IF_MAX_LUTSIZE )
        {
            Abc_Print( 1, "Skipping LUTs of size more than %d.\n", i );
            ABC_FREE( p->pName );
            ABC_FREE( p );
            ABC_FREE( pStrMem );
            Vec_PtrFree( vStrs );
            return NULL;
        }
        i++;
    }
    p->LutMax = i-1;

    // check the library
    if ( p->fVarPinDelays )
    {
        for ( i = 1; i <= p->LutMax; i++ )
            for ( k = 0; k < i; k++ )
            {
                if ( p->pLutDelays[i][k] <= 0.0 )
                    Abc_Print( 0, "Pin %d of LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n", 
                        k, i, p->pLutDelays[i][k] );
                if ( k && p->pLutDelays[i][k-1] > p->pLutDelays[i][k] )
                    Abc_Print( 0, "Pin %d of LUT %d has delay %f. Pin %d of LUT %d has delay %f. Pin delays should be in non-decreasing order. Technology mapping may not work correctly.\n", 
                        k-1, i, p->pLutDelays[i][k-1], 
                        k, i, p->pLutDelays[i][k] );
            }
    }
    else
    {
        for ( i = 1; i <= p->LutMax; i++ )
        {
            if ( p->pLutDelays[i][0] <= 0.0 )
                Abc_Print( 0, "LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n", 
                    i, p->pLutDelays[i][0] );
        }
    }

    // cleanup
    ABC_FREE( pStrMem );
    Vec_PtrFree( vStrs );
    return p;
}